

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::vector<unsigned_char,pstd::pmr::polymorphic_allocator<unsigned_char>>::vector<unsigned_char*>
          (vector<unsigned_char,pstd::pmr::polymorphic_allocator<unsigned_char>> *this,uchar *first,
          uchar *last,polymorphic_allocator<unsigned_char> *alloc)

{
  long lVar1;
  
  *(memory_resource **)this = alloc->memoryResource;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::reserve
            ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)this,
             (long)last - (long)first);
  for (lVar1 = 0; first + lVar1 != last; lVar1 = lVar1 + 1) {
    *(uchar *)(*(long *)(this + 8) + lVar1) = first[lVar1];
  }
  *(undefined8 *)(this + 0x18) = *(undefined8 *)(this + 0x10);
  return;
}

Assistant:

vector(InputIt first, InputIt last, const Allocator &alloc = {}) : alloc(alloc) {
        reserve(last - first);
        size_t i = 0;
        for (InputIt iter = first; iter != last; ++iter, ++i)
            this->alloc.template construct<T>(ptr + i, *iter);
        nStored = nAlloc;
    }